

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser_test.cpp
# Opt level: O0

void TestParseCondition(void)

{
  int iVar1;
  element_type *peVar2;
  allocator<char> local_1be1;
  string local_1be0;
  allocator<char> local_1bb9;
  string local_1bb8 [32];
  Date local_1b98;
  allocator<char> local_1b89;
  string local_1b88;
  allocator<char> local_1b61;
  string local_1b60 [32];
  Date local_1b40;
  allocator<char> local_1b31;
  string local_1b30;
  allocator<char> local_1b09;
  string local_1b08 [36];
  Date local_1ae4;
  undefined1 local_1ad8 [8];
  shared_ptr<Node> root_9;
  string local_1ac0 [32];
  istringstream local_1aa0 [8];
  istringstream is_9;
  allocator<char> local_1919;
  string local_1918;
  allocator<char> local_18f1;
  string local_18f0 [32];
  Date local_18d0;
  allocator<char> local_18c1;
  string local_18c0;
  allocator<char> local_1899;
  string local_1898 [36];
  Date local_1874;
  undefined1 local_1868 [8];
  shared_ptr<Node> root_8;
  string local_1850 [32];
  istringstream local_1830 [8];
  istringstream is_8;
  allocator<char> local_16a9;
  string local_16a8;
  allocator<char> local_1681;
  string local_1680 [32];
  Date local_1660;
  allocator<char> local_1651;
  string local_1650;
  allocator<char> local_1629;
  string local_1628 [32];
  Date local_1608;
  allocator<char> local_15f9;
  string local_15f8;
  allocator<char> local_15d1;
  string local_15d0 [32];
  Date local_15b0;
  allocator<char> local_15a1;
  string local_15a0;
  allocator<char> local_1579;
  string local_1578 [36];
  Date local_1554;
  undefined1 local_1548 [8];
  shared_ptr<Node> root_7;
  string local_1530 [32];
  istringstream local_1510 [8];
  istringstream is_7;
  allocator<char> local_1389;
  string local_1388;
  allocator<char> local_1361;
  string local_1360 [32];
  Date local_1340;
  allocator<char> local_1331;
  string local_1330;
  allocator<char> local_1309;
  string local_1308 [32];
  Date local_12e8;
  allocator<char> local_12d9;
  string local_12d8;
  allocator<char> local_12b1;
  string local_12b0 [32];
  Date local_1290;
  allocator<char> local_1281;
  string local_1280;
  allocator<char> local_1259;
  string local_1258 [36];
  Date local_1234;
  undefined1 local_1228 [8];
  shared_ptr<Node> root_6;
  string local_1210 [32];
  istringstream local_11f0 [8];
  istringstream is_6;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040 [32];
  Date local_1020;
  allocator<char> local_1011;
  string local_1010;
  allocator<char> local_fe9;
  string local_fe8 [36];
  Date local_fc4;
  undefined1 local_fb8 [8];
  shared_ptr<Node> root_5;
  string local_fa0 [32];
  istringstream local_f80 [8];
  istringstream is_5;
  allocator<char> local_df9;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0 [32];
  Date local_db0;
  allocator<char> local_da1;
  string local_da0;
  allocator<char> local_d79;
  string local_d78 [32];
  Date local_d58;
  allocator<char> local_d49;
  string local_d48;
  allocator<char> local_d21;
  string local_d20 [36];
  Date local_cfc;
  undefined1 local_cf0 [8];
  shared_ptr<Node> root_4;
  string local_cd8 [32];
  istringstream local_cb8 [8];
  istringstream is_4;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08 [32];
  Date local_ae8;
  allocator<char> local_ad9;
  string local_ad8;
  allocator<char> local_ab1;
  string local_ab0 [32];
  Date local_a90;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58 [36];
  Date local_a34;
  undefined1 local_a28 [8];
  shared_ptr<Node> root_3;
  string local_a10 [32];
  istringstream local_9f0 [8];
  istringstream is_3;
  allocator<char> local_869;
  string local_868;
  allocator<char> local_841;
  string local_840 [32];
  Date local_820;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8 [32];
  Date local_7c8;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790 [32];
  Date local_770;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738 [32];
  Date local_718;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0 [36];
  Date local_6bc;
  undefined1 local_6b0 [8];
  shared_ptr<Node> root_2;
  string local_698 [32];
  istringstream local_678 [8];
  istringstream is_2;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8 [32];
  Date local_4a8;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470 [36];
  Date local_44c;
  undefined1 local_440 [8];
  shared_ptr<Node> root_1;
  string local_428 [32];
  istringstream local_408 [8];
  istringstream is_1;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258 [32];
  Date local_238;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200 [36];
  Date local_1dc;
  undefined1 local_1d0 [8];
  shared_ptr<Node> root;
  allocator<char> local_1a9;
  string local_1a8 [32];
  istringstream local_188 [8];
  istringstream is;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"date != 2017-11-18",&local_1a9);
  std::__cxx11::istringstream::istringstream(local_188,local_1a8,8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  ParseCondition((istream *)local_1d0);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1d0);
  Date::Date(&local_1dc,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"",&local_201);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1dc,local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"Parse condition 1",&local_229);
  Assert((bool)((byte)iVar1 & 1),&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1d0);
  Date::Date(&local_238,0x7e1,0xb,0x12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"",&local_259);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_238,local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"Parse condition 2",&local_281);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_1d0);
  std::__cxx11::istringstream::~istringstream(local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_428,"event == \"sport event\"",
             (allocator<char> *)
             ((long)&root_1.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_408,local_428,8);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_1.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_440);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_440);
  Date::Date(&local_44c,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_470,"sport event",&local_471);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_44c,local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"Parse condition 3",&local_499);
  Assert((bool)((byte)iVar1 & 1),&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator(&local_471);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_440);
  Date::Date(&local_4a8,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4c8,"holiday",&local_4c9);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_4a8,local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Parse condition 4",&local_4f1);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_440);
  std::__cxx11::istringstream::~istringstream(local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_698,"date >= 2017-01-01 AND date < 2017-07-01",
             (allocator<char> *)
             ((long)&root_2.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_678,local_698,8);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_2.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_6b0);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6b0);
  Date::Date(&local_6bc,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"",&local_6e1);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_6bc,local_6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"Parse condition 5",&local_709);
  Assert((bool)((byte)iVar1 & 1),&local_708);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6b0);
  Date::Date(&local_718,0x7e1,3,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_738,"",&local_739);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_718,local_738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"Parse condition 6",&local_761);
  Assert((bool)((byte)iVar1 & 1),&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator(&local_739);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6b0);
  Date::Date(&local_770,0x7e1,6,0x1e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_790,"",&local_791);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_770,local_790);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b8,"Parse condition 7",&local_7b9);
  Assert((bool)((byte)iVar1 & 1),&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator(&local_791);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6b0);
  Date::Date(&local_7c8,0x7e1,7,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7e8,"",&local_7e9);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_7c8,local_7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"Parse condition 8",&local_811);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6b0);
  Date::Date(&local_820,0x7e0,0xc,0x1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_840,"",&local_841);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_820,local_840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"Parse condition 9",&local_869);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator(&local_841);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_6b0);
  std::__cxx11::istringstream::~istringstream(local_678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a10,"event != \"sport event\" AND event != \"Wednesday\"",
             (allocator<char> *)
             ((long)&root_3.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_9f0,local_a10,8);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_3.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_a28);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_a28);
  Date::Date(&local_a34,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a58,"holiday",&local_a59);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_a34,local_a58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80,"Parse condition 10",&local_a81);
  Assert((bool)((byte)iVar1 & 1),&local_a80);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator(&local_a59);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_a28);
  Date::Date(&local_a90,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ab0,"sport event",&local_ab1);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_a90,local_ab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ad8,"Parse condition 11",&local_ad9);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_ad8);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::allocator<char>::~allocator(&local_ad9);
  std::__cxx11::string::~string(local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_a28);
  Date::Date(&local_ae8,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b08,"Wednesday",&local_b09);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_ae8,local_b08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b30,"Parse condition 12",&local_b31);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_b30);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_a28);
  std::__cxx11::istringstream::~istringstream(local_9f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_cd8,"event == \"holiday AND date == 2017-11-18\"",
             (allocator<char> *)
             ((long)&root_4.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_cb8,local_cd8,8);
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_4.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_cf0);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_cf0);
  Date::Date(&local_cfc,0x7e1,0xb,0x12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d20,"holiday",&local_d21);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_cfc,local_d20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d48,"Parse condition 13",&local_d49);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_d48);
  std::__cxx11::string::~string((string *)&local_d48);
  std::allocator<char>::~allocator(&local_d49);
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator(&local_d21);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_cf0);
  Date::Date(&local_d58,0x7e1,0xb,0x12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d78,"work day",&local_d79);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_d58,local_d78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_da0,"Parse condition 14",&local_da1);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_da0);
  std::__cxx11::string::~string((string *)&local_da0);
  std::allocator<char>::~allocator(&local_da1);
  std::__cxx11::string::~string(local_d78);
  std::allocator<char>::~allocator(&local_d79);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_cf0);
  Date::Date(&local_db0,1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_dd0,"holiday AND date == 2017-11-18",&local_dd1);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_db0,local_dd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_df8,"Parse condition 15",&local_df9);
  Assert((bool)((byte)iVar1 & 1),&local_df8);
  std::__cxx11::string::~string((string *)&local_df8);
  std::allocator<char>::~allocator(&local_df9);
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_cf0);
  std::__cxx11::istringstream::~istringstream(local_cb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_fa0,"((event == \"holiday\" AND date == 2017-01-01))",
             (allocator<char> *)
             ((long)&root_5.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_f80,local_fa0,8);
  std::__cxx11::string::~string(local_fa0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_5.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_fb8);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_fb8);
  Date::Date(&local_fc4,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fe8,"holiday",&local_fe9);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_fc4,local_fe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1010,"Parse condition 16",&local_1011);
  Assert((bool)((byte)iVar1 & 1),&local_1010);
  std::__cxx11::string::~string((string *)&local_1010);
  std::allocator<char>::~allocator(&local_1011);
  std::__cxx11::string::~string(local_fe8);
  std::allocator<char>::~allocator(&local_fe9);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_fb8);
  Date::Date(&local_1020,0x7e1,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1040,"holiday",&local_1041);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1020,local_1040);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1068,"Parse condition 17",&local_1069);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_1068);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::__cxx11::string::~string(local_1040);
  std::allocator<char>::~allocator(&local_1041);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_fb8);
  std::__cxx11::istringstream::~istringstream(local_f80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1210,"date > 2017-01-01 AND (event == \"holiday\" OR date < 2017-07-01)",
             (allocator<char> *)
             ((long)&root_6.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_11f0,local_1210,8);
  std::__cxx11::string::~string(local_1210);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_6.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_1228);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1228);
  Date::Date(&local_1234,0x7e0,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1258,"holiday",&local_1259);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1234,local_1258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1280,"Parse condition 18",&local_1281);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_1280);
  std::__cxx11::string::~string((string *)&local_1280);
  std::allocator<char>::~allocator(&local_1281);
  std::__cxx11::string::~string(local_1258);
  std::allocator<char>::~allocator(&local_1259);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1228);
  Date::Date(&local_1290,0x7e1,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_12b0,"holiday",&local_12b1);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1290,local_12b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12d8,"Parse condition 19",&local_12d9);
  Assert((bool)((byte)iVar1 & 1),&local_12d8);
  std::__cxx11::string::~string((string *)&local_12d8);
  std::allocator<char>::~allocator(&local_12d9);
  std::__cxx11::string::~string(local_12b0);
  std::allocator<char>::~allocator(&local_12b1);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1228);
  Date::Date(&local_12e8,0x7e1,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1308,"workday",&local_1309);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_12e8,local_1308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1330,"Parse condition 20",&local_1331);
  Assert((bool)((byte)iVar1 & 1),&local_1330);
  std::__cxx11::string::~string((string *)&local_1330);
  std::allocator<char>::~allocator(&local_1331);
  std::__cxx11::string::~string(local_1308);
  std::allocator<char>::~allocator(&local_1309);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1228);
  Date::Date(&local_1340,0x7e2,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1360,"workday",&local_1361);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1340,local_1360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1388,"Parse condition 21",&local_1389);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_1388);
  std::__cxx11::string::~string((string *)&local_1388);
  std::allocator<char>::~allocator(&local_1389);
  std::__cxx11::string::~string(local_1360);
  std::allocator<char>::~allocator(&local_1361);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_1228);
  std::__cxx11::istringstream::~istringstream(local_11f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1530,"date > 2017-01-01 AND event == \"holiday\" OR date < 2017-07-01",
             (allocator<char> *)
             ((long)&root_7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_1510,local_1530,8);
  std::__cxx11::string::~string(local_1530);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_1548);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1548);
  Date::Date(&local_1554,0x7e0,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1578,"event",&local_1579);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1554,local_1578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15a0,"Parse condition 22",&local_15a1);
  Assert((bool)((byte)iVar1 & 1),&local_15a0);
  std::__cxx11::string::~string((string *)&local_15a0);
  std::allocator<char>::~allocator(&local_15a1);
  std::__cxx11::string::~string(local_1578);
  std::allocator<char>::~allocator(&local_1579);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1548);
  Date::Date(&local_15b0,0x7e1,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_15d0,"holiday",&local_15d1);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_15b0,local_15d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15f8,"Parse condition 23",&local_15f9);
  Assert((bool)((byte)iVar1 & 1),&local_15f8);
  std::__cxx11::string::~string((string *)&local_15f8);
  std::allocator<char>::~allocator(&local_15f9);
  std::__cxx11::string::~string(local_15d0);
  std::allocator<char>::~allocator(&local_15d1);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1548);
  Date::Date(&local_1608,0x7e1,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1628,"workday",&local_1629);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1608,local_1628);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1650,"Parse condition 24",&local_1651);
  Assert((bool)((byte)iVar1 & 1),&local_1650);
  std::__cxx11::string::~string((string *)&local_1650);
  std::allocator<char>::~allocator(&local_1651);
  std::__cxx11::string::~string(local_1628);
  std::allocator<char>::~allocator(&local_1629);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1548);
  Date::Date(&local_1660,0x7e2,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1680,"workday",&local_1681);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1660,local_1680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16a8,"Parse condition 25",&local_16a9);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_16a8);
  std::__cxx11::string::~string((string *)&local_16a8);
  std::allocator<char>::~allocator(&local_16a9);
  std::__cxx11::string::~string(local_1680);
  std::allocator<char>::~allocator(&local_1681);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_1548);
  std::__cxx11::istringstream::~istringstream(local_1510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1850,"((date == 2017-01-01 AND event == \"holiday\"))",
             (allocator<char> *)
             ((long)&root_8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_1830,local_1850,8);
  std::__cxx11::string::~string(local_1850);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_1868);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1868);
  Date::Date(&local_1874,0x7e1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1898,"holiday",&local_1899);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1874,local_1898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18c0,"Parse condition 26",&local_18c1);
  Assert((bool)((byte)iVar1 & 1),&local_18c0);
  std::__cxx11::string::~string((string *)&local_18c0);
  std::allocator<char>::~allocator(&local_18c1);
  std::__cxx11::string::~string(local_1898);
  std::allocator<char>::~allocator(&local_1899);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1868);
  Date::Date(&local_18d0,0x7e1,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_18f0,"holiday",&local_18f1);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_18d0,local_18f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1918,"Parse condition 27",&local_1919);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_1918);
  std::__cxx11::string::~string((string *)&local_1918);
  std::allocator<char>::~allocator(&local_1919);
  std::__cxx11::string::~string(local_18f0);
  std::allocator<char>::~allocator(&local_18f1);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_1868);
  std::__cxx11::istringstream::~istringstream(local_1830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ac0,"((event == \"2017-01-01\" OR date > 2016-01-01))",
             (allocator<char> *)
             ((long)&root_9.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::istringstream::istringstream(local_1aa0,local_1ac0,8);
  std::__cxx11::string::~string(local_1ac0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_9.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  ParseCondition((istream *)local_1ad8);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1ad8);
  Date::Date(&local_1ae4,1,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b08,"2017-01-01",&local_1b09);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1ae4,local_1b08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b30,"Parse condition 28",&local_1b31);
  Assert((bool)((byte)iVar1 & 1),&local_1b30);
  std::__cxx11::string::~string((string *)&local_1b30);
  std::allocator<char>::~allocator(&local_1b31);
  std::__cxx11::string::~string(local_1b08);
  std::allocator<char>::~allocator(&local_1b09);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1ad8);
  Date::Date(&local_1b40,0x7e0,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b60,"event",&local_1b61);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1b40,local_1b60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b88,"Parse condition 29",&local_1b89);
  Assert((bool)(((byte)iVar1 ^ 1) & 1),&local_1b88);
  std::__cxx11::string::~string((string *)&local_1b88);
  std::allocator<char>::~allocator(&local_1b89);
  std::__cxx11::string::~string(local_1b60);
  std::allocator<char>::~allocator(&local_1b61);
  peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1ad8);
  Date::Date(&local_1b98,0x7e0,1,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1bb8,"event",&local_1bb9);
  iVar1 = (**peVar2->_vptr_Node)(peVar2,&local_1b98,local_1bb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1be0,"Parse condition 30",&local_1be1);
  Assert((bool)((byte)iVar1 & 1),&local_1be0);
  std::__cxx11::string::~string((string *)&local_1be0);
  std::allocator<char>::~allocator(&local_1be1);
  std::__cxx11::string::~string(local_1bb8);
  std::allocator<char>::~allocator(&local_1bb9);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_1ad8);
  std::__cxx11::istringstream::~istringstream(local_1aa0);
  return;
}

Assistant:

void TestParseCondition() {
    {
        istringstream is("date != 2017-11-18");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, ""), "Parse condition 1");
        Assert(!root->Evaluate({2017, 11, 18}, ""), "Parse condition 2");
    }
    {
        istringstream is(R"(event == "sport event")");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, "sport event"), "Parse condition 3");
        Assert(!root->Evaluate({2017, 1, 1}, "holiday"), "Parse condition 4");
    }
    {
        istringstream is("date >= 2017-01-01 AND date < 2017-07-01");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, ""), "Parse condition 5");
        Assert(root->Evaluate({2017, 3, 1}, ""), "Parse condition 6");
        Assert(root->Evaluate({2017, 6, 30}, ""), "Parse condition 7");
        Assert(!root->Evaluate({2017, 7, 1}, ""), "Parse condition 8");
        Assert(!root->Evaluate({2016, 12, 31}, ""), "Parse condition 9");
    }
    {
        istringstream is(R"(event != "sport event" AND event != "Wednesday")");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, "holiday"), "Parse condition 10");
        Assert(!root->Evaluate({2017, 1, 1}, "sport event"), "Parse condition 11");
        Assert(!root->Evaluate({2017, 1, 1}, "Wednesday"), "Parse condition 12");
    }
    {
        istringstream is(R"(event == "holiday AND date == 2017-11-18")");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(!root->Evaluate({2017, 11, 18}, "holiday"), "Parse condition 13");
        Assert(!root->Evaluate({2017, 11, 18}, "work day"), "Parse condition 14");
        Assert(root->Evaluate({1, 1, 1}, "holiday AND date == 2017-11-18"), "Parse condition 15");
    }
    {
        istringstream is(R"(((event == "holiday" AND date == 2017-01-01)))");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, "holiday"), "Parse condition 16");
        Assert(!root->Evaluate({2017, 1, 2}, "holiday"), "Parse condition 17");
    }
    {
        istringstream is(R"(date > 2017-01-01 AND (event == "holiday" OR date < 2017-07-01))");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(!root->Evaluate({2016, 1, 1}, "holiday"), "Parse condition 18");
        Assert(root->Evaluate({2017, 1, 2}, "holiday"), "Parse condition 19");
        Assert(root->Evaluate({2017, 1, 2}, "workday"), "Parse condition 20");
        Assert(!root->Evaluate({2018, 1, 2}, "workday"), "Parse condition 21");
    }
    {
        istringstream is(R"(date > 2017-01-01 AND event == "holiday" OR date < 2017-07-01)");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2016, 1, 1}, "event"), "Parse condition 22");
        Assert(root->Evaluate({2017, 1, 2}, "holiday"), "Parse condition 23");
        Assert(root->Evaluate({2017, 1, 2}, "workday"), "Parse condition 24");
        Assert(!root->Evaluate({2018, 1, 2}, "workday"), "Parse condition 25");
    }
    {
        istringstream is(R"(((date == 2017-01-01 AND event == "holiday")))");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, "holiday"), "Parse condition 26");
        Assert(!root->Evaluate({2017, 1, 2}, "holiday"), "Parse condition 27");
    }
    {
        istringstream is(R"(((event == "2017-01-01" OR date > 2016-01-01)))");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({1, 1, 1}, "2017-01-01"), "Parse condition 28");
        Assert(!root->Evaluate({2016, 1, 1}, "event"), "Parse condition 29");
        Assert(root->Evaluate({2016, 1, 2}, "event"), "Parse condition 30");
    }
}